

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<int> * __thiscall QList<int>::fill(QList<int> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<int> *pQVar3;
  DataOps *n;
  char *in_RDX;
  __off_t __length;
  QArrayDataPointer<int> *in_RDI;
  long in_FS_OFFSET;
  int copy;
  DataPointer detached;
  QArrayDataPointer<int> *in_stack_ffffffffffffff78;
  char *pcVar4;
  QArrayDataPointer<int> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  parameter_type t_00;
  QArrayDataPointer<int> *in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffff98;
  QArrayDataPointer<int> *in_stack_ffffffffffffffa0;
  qsizetype local_30;
  QArrayDataPointer<int> local_28;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (char *)0xffffffffffffffff) {
    local_10 = (char *)size((QList<int> *)in_RDI);
  }
  QArrayDataPointer<int>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<int>::needsDetach(in_stack_ffffffffffffff80);
  pcVar4 = local_10;
  if ((bVar1) || (qVar2 = capacity((QList<int> *)0x104a55), qVar2 < (long)pcVar4)) {
    local_28.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_28.ptr = (int *)0xaaaaaaaaaaaaaaaa;
    local_28.size = -0x5555555555555556;
    QArrayDataPointer<int>::operator->(in_RDI);
    QArrayDataPointer<int>::detachCapacity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QArrayDataPointer<int>::QArrayDataPointer
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (qsizetype)in_stack_ffffffffffffff90,
               (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    QArrayDataPointer<int>::operator->(&local_28);
    QtPrivate::QPodArrayOps<int>::copyAppend
              ((QPodArrayOps<int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (parameter_type)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    QArrayDataPointer<int>::swap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QArrayDataPointer<int>::~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    QArrayDataPointer<int>::operator->(in_RDI);
    t_00 = (parameter_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    QArrayDataPointer<int>::begin((QArrayDataPointer<int> *)0x104b11);
    pQVar3 = (QPodArrayOps<int> *)QArrayDataPointer<int>::begin((QArrayDataPointer<int> *)0x104b20);
    local_30 = size((QList<int> *)in_RDI);
    qMin<long_long>(&local_30,(longlong *)&local_10);
    QtPrivate::QPodArrayOps<int>::assign
              ((QPodArrayOps<int> *)in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78,
               (int *)0x104b65,t_00);
    pcVar4 = local_10;
    qVar2 = size((QList<int> *)in_RDI);
    if (qVar2 < (long)pcVar4) {
      n = QArrayDataPointer<int>::operator->(in_RDI);
      pcVar4 = local_10;
      size((QList<int> *)in_RDI);
      QtPrivate::QPodArrayOps<int>::copyAppend
                (pQVar3,(qsizetype)n,(parameter_type)((ulong)pcVar4 >> 0x20));
    }
    else {
      pcVar4 = local_10;
      qVar2 = size((QList<int> *)in_RDI);
      if ((long)pcVar4 < qVar2) {
        pQVar3 = (QPodArrayOps<int> *)QArrayDataPointer<int>::operator->(in_RDI);
        QtPrivate::QPodArrayOps<int>::truncate(pQVar3,local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<int> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}